

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void sqlite3WhereEnd(WhereInfo *pWInfo)

{
  byte bVar1;
  Parse *pParse_00;
  Vdbe *v_00;
  SrcList *pSVar2;
  sqlite3 *db_00;
  WhereLoop *pWVar3;
  Table *pTab_00;
  WhereTerm *pWVar4;
  i16 iVar5;
  uint uVar6;
  int iVar7;
  int op_00;
  WhereLevel *pWVar8;
  Index *pIVar9;
  Index *pPk;
  int x;
  Table *pTab;
  SrcList_item *pTabItem;
  Index *pIdx_1;
  VdbeOp *pOp;
  int last;
  int k;
  int ws;
  int j_1;
  InLoop *pIn;
  int op;
  int j;
  int r1;
  int n;
  Index *pIdx;
  int addrSeek;
  int addr;
  sqlite3 *db;
  SrcList *pTabList;
  WhereLoop *pLoop;
  WhereLevel *pLevel;
  int i;
  Vdbe *v;
  Parse *pParse;
  WhereInfo *pWInfo_local;
  
  pParse_00 = pWInfo->pParse;
  v_00 = pParse_00->pVdbe;
  pSVar2 = pWInfo->pTabList;
  db_00 = pParse_00->db;
  sqlite3ExprCacheClear(pParse_00);
  pLevel._4_4_ = (uint)pWInfo->nLevel;
  while (pLevel._4_4_ = pLevel._4_4_ - 1, -1 < (int)pLevel._4_4_) {
    pWVar8 = pWInfo->a + (int)pLevel._4_4_;
    pWVar3 = pWVar8->pWLoop;
    if (pWVar8->op == 0xa6) {
      sqlite3VdbeResolveLabel(v_00,pWVar8->addrCont);
    }
    else {
      pIdx._0_4_ = 0;
      if ((((pWInfo->eDistinct == '\x02') && ((pWVar3->wsFlags & 0x200) != 0)) &&
          (pIVar9 = (pWVar3->u).btree.pIndex, (char)pIVar9->field_0x63 < '\0')) &&
         ((uVar6 = (uint)(pWVar3->u).btree.nIdxCol, uVar6 != 0 &&
          (0x23 < pIVar9->aiRowLogEst[(int)uVar6])))) {
        iVar7 = pParse_00->nMem + 1;
        for (pIn._4_4_ = 0; pIn._4_4_ < (int)uVar6; pIn._4_4_ = pIn._4_4_ + 1) {
          sqlite3VdbeAddOp3(v_00,0x60,pWVar8->iIdxCur,pIn._4_4_,iVar7 + pIn._4_4_);
        }
        pParse_00->nMem = uVar6 + 1 + pParse_00->nMem;
        op_00 = 0x1b;
        if (pWVar8->op == '\x06') {
          op_00 = 0x18;
        }
        pIdx._0_4_ = sqlite3VdbeAddOp4Int(v_00,op_00,pWVar8->iIdxCur,0,iVar7,uVar6);
        sqlite3VdbeAddOp2(v_00,0xd,1,pWVar8->p2);
      }
      sqlite3VdbeResolveLabel(v_00,pWVar8->addrCont);
      sqlite3VdbeAddOp3(v_00,(uint)pWVar8->op,pWVar8->p1,pWVar8->p2,(uint)pWVar8->p3);
      sqlite3VdbeChangeP5(v_00,(ushort)pWVar8->p5);
      if ((int)pIdx != 0) {
        sqlite3VdbeJumpHere(v_00,(int)pIdx);
      }
    }
    if (((pWVar3->wsFlags & 0x800) != 0) && (0 < (pWVar8->u).in.nIn)) {
      sqlite3VdbeResolveLabel(v_00,pWVar8->addrNxt);
      k = (pWVar8->u).in.nIn;
      _ws = (pWVar8->u).in.aInLoop + (k + -1);
      for (; 0 < k; k = k + -1) {
        sqlite3VdbeJumpHere(v_00,_ws->addrInTop + 1);
        if (_ws->eEndLoopOp != 0xa6) {
          sqlite3VdbeAddOp2(v_00,(uint)_ws->eEndLoopOp,_ws->iCur,_ws->addrInTop);
        }
        sqlite3VdbeJumpHere(v_00,_ws->addrInTop + -1);
        _ws = _ws + -1;
      }
    }
    sqlite3VdbeResolveLabel(v_00,pWVar8->addrBrk);
    if (pWVar8->addrSkip != 0) {
      sqlite3VdbeGoto(v_00,pWVar8->addrSkip);
      sqlite3VdbeJumpHere(v_00,pWVar8->addrSkip);
      sqlite3VdbeJumpHere(v_00,pWVar8->addrSkip + -2);
    }
    if (pWVar8->addrLikeRep != 0) {
      sqlite3VdbeAddOp2(v_00,0x30,pWVar8->iLikeRepCntr >> 1,pWVar8->addrLikeRep);
    }
    if (pWVar8->iLeftJoin != 0) {
      uVar6 = pWVar3->wsFlags;
      iVar7 = sqlite3VdbeAddOp1(v_00,0x2e,pWVar8->iLeftJoin);
      if ((uVar6 & 0x40) == 0) {
        sqlite3VdbeAddOp1(v_00,0x7c,pSVar2->a[(int)pLevel._4_4_].iCursor);
      }
      if (((uVar6 & 0x200) != 0) ||
         (((uVar6 & 0x2000) != 0 && ((pWVar8->u).pCovidx != (Index *)0x0)))) {
        sqlite3VdbeAddOp1(v_00,0x7c,pWVar8->iIdxCur);
      }
      if (pWVar8->op == '4') {
        sqlite3VdbeAddOp2(v_00,0xe,pWVar8->p1,pWVar8->addrFirst);
      }
      else {
        sqlite3VdbeGoto(v_00,pWVar8->addrFirst);
      }
      sqlite3VdbeJumpHere(v_00,iVar7);
    }
  }
  sqlite3VdbeResolveLabel(v_00,pWInfo->iBreak);
  pLoop = (WhereLoop *)pWInfo->a;
  for (pLevel._4_4_ = 0; (int)pLevel._4_4_ < (int)(uint)pWInfo->nLevel;
      pLevel._4_4_ = pLevel._4_4_ + 1) {
    pTabItem = (SrcList_item *)0x0;
    bVar1 = (byte)pLoop->nLTerm;
    pTab_00 = pSVar2->a[bVar1].pTab;
    pWVar4 = pLoop->aLTermSpace[0];
    if (((byte)pSVar2->a[bVar1].fg.field_0x1 >> 4 & 1) == 0) {
      if (((pWVar4->u).leftColumn & 0x240U) == 0) {
        if (((pWVar4->u).leftColumn & 0x2000U) != 0) {
          pTabItem = (SrcList_item *)pLoop->aLTerm;
        }
      }
      else {
        pTabItem = *(SrcList_item **)&pWVar4->iField;
      }
      if ((pTabItem != (SrcList_item *)0x0) &&
         (((pWInfo->eOnePass == '\0' || ((*(uint *)(pTabItem->zAlias + 0x40) & 0x20) != 0)) &&
          (db_00->mallocFailed == '\0')))) {
        iVar7 = sqlite3VdbeCurrentAddr(v_00);
        pOp._4_4_ = *(int *)((long)&pLoop->u + 8);
        pIdx_1 = (Index *)sqlite3VdbeGetOp(v_00,pOp._4_4_);
        for (; pOp._4_4_ < iVar7; pOp._4_4_ = pOp._4_4_ + 1) {
          if (*(int *)((long)&pIdx_1->zName + 4) == *(int *)((long)&pLoop->prereq + 4)) {
            if (*(char *)&pIdx_1->zName == '`') {
              pPk._4_4_ = *(int *)&pIdx_1->aiColumn;
              if ((pTab_00->tabFlags & 0x20) != 0) {
                pIVar9 = sqlite3PrimaryKeyIndex(pTab_00);
                pPk._4_4_ = (int)pIVar9->aiColumn[pPk._4_4_];
              }
              iVar5 = sqlite3ColumnOfIndex((Index *)pTabItem,(i16)pPk._4_4_);
              if (-1 < iVar5) {
                *(int *)&pIdx_1->aiColumn = (int)iVar5;
                *(int *)((long)&pIdx_1->zName + 4) = (int)pLoop->maskSelf;
              }
            }
            else if (*(char *)&pIdx_1->zName == '{') {
              *(int *)((long)&pIdx_1->zName + 4) = (int)pLoop->maskSelf;
              *(undefined1 *)&pIdx_1->zName = 0x81;
            }
            else if (*(char *)&pIdx_1->zName == '\x17') {
              *(int *)((long)&pIdx_1->zName + 4) = (int)pLoop->maskSelf;
            }
          }
          pIdx_1 = (Index *)&pIdx_1->pTable;
        }
      }
    }
    else {
      translateColumnToCopy
                (pParse_00,*(int *)((long)&pLoop->u + 8),*(int *)((long)&pLoop->prereq + 4),
                 pSVar2->a[bVar1].regResult,0);
    }
    pLoop = (WhereLoop *)(pLoop->aLTermSpace + 2);
  }
  pParse_00->nQueryLoop = pWInfo->savedNQueryLoop;
  whereInfoFree(db_00,pWInfo);
  return;
}

Assistant:

SQLITE_PRIVATE void sqlite3WhereEnd(WhereInfo *pWInfo){
  Parse *pParse = pWInfo->pParse;
  Vdbe *v = pParse->pVdbe;
  int i;
  WhereLevel *pLevel;
  WhereLoop *pLoop;
  SrcList *pTabList = pWInfo->pTabList;
  sqlite3 *db = pParse->db;

  /* Generate loop termination code.
  */
  VdbeModuleComment((v, "End WHERE-core"));
  sqlite3ExprCacheClear(pParse);
  for(i=pWInfo->nLevel-1; i>=0; i--){
    int addr;
    pLevel = &pWInfo->a[i];
    pLoop = pLevel->pWLoop;
    if( pLevel->op!=OP_Noop ){
#ifndef SQLITE_DISABLE_SKIPAHEAD_DISTINCT
      int addrSeek = 0;
      Index *pIdx;
      int n;
      if( pWInfo->eDistinct==WHERE_DISTINCT_ORDERED
       && (pLoop->wsFlags & WHERE_INDEXED)!=0
       && (pIdx = pLoop->u.btree.pIndex)->hasStat1
       && (n = pLoop->u.btree.nIdxCol)>0
       && pIdx->aiRowLogEst[n]>=36
      ){
        int r1 = pParse->nMem+1;
        int j, op;
        for(j=0; j<n; j++){
          sqlite3VdbeAddOp3(v, OP_Column, pLevel->iIdxCur, j, r1+j);
        }
        pParse->nMem += n+1;
        op = pLevel->op==OP_Prev ? OP_SeekLT : OP_SeekGT;
        addrSeek = sqlite3VdbeAddOp4Int(v, op, pLevel->iIdxCur, 0, r1, n);
        VdbeCoverageIf(v, op==OP_SeekLT);
        VdbeCoverageIf(v, op==OP_SeekGT);
        sqlite3VdbeAddOp2(v, OP_Goto, 1, pLevel->p2);
      }
#endif /* SQLITE_DISABLE_SKIPAHEAD_DISTINCT */
      /* The common case: Advance to the next row */
      sqlite3VdbeResolveLabel(v, pLevel->addrCont);
      sqlite3VdbeAddOp3(v, pLevel->op, pLevel->p1, pLevel->p2, pLevel->p3);
      sqlite3VdbeChangeP5(v, pLevel->p5);
      VdbeCoverage(v);
      VdbeCoverageIf(v, pLevel->op==OP_Next);
      VdbeCoverageIf(v, pLevel->op==OP_Prev);
      VdbeCoverageIf(v, pLevel->op==OP_VNext);
#ifndef SQLITE_DISABLE_SKIPAHEAD_DISTINCT
      if( addrSeek ) sqlite3VdbeJumpHere(v, addrSeek);
#endif
    }else{
      sqlite3VdbeResolveLabel(v, pLevel->addrCont);
    }
    if( pLoop->wsFlags & WHERE_IN_ABLE && pLevel->u.in.nIn>0 ){
      struct InLoop *pIn;
      int j;
      sqlite3VdbeResolveLabel(v, pLevel->addrNxt);
      for(j=pLevel->u.in.nIn, pIn=&pLevel->u.in.aInLoop[j-1]; j>0; j--, pIn--){
        sqlite3VdbeJumpHere(v, pIn->addrInTop+1);
        if( pIn->eEndLoopOp!=OP_Noop ){
          sqlite3VdbeAddOp2(v, pIn->eEndLoopOp, pIn->iCur, pIn->addrInTop);
          VdbeCoverage(v);
          VdbeCoverageIf(v, pIn->eEndLoopOp==OP_PrevIfOpen);
          VdbeCoverageIf(v, pIn->eEndLoopOp==OP_NextIfOpen);
        }
        sqlite3VdbeJumpHere(v, pIn->addrInTop-1);
      }
    }
    sqlite3VdbeResolveLabel(v, pLevel->addrBrk);
    if( pLevel->addrSkip ){
      sqlite3VdbeGoto(v, pLevel->addrSkip);
      VdbeComment((v, "next skip-scan on %s", pLoop->u.btree.pIndex->zName));
      sqlite3VdbeJumpHere(v, pLevel->addrSkip);
      sqlite3VdbeJumpHere(v, pLevel->addrSkip-2);
    }
#ifndef SQLITE_LIKE_DOESNT_MATCH_BLOBS
    if( pLevel->addrLikeRep ){
      sqlite3VdbeAddOp2(v, OP_DecrJumpZero, (int)(pLevel->iLikeRepCntr>>1),
                        pLevel->addrLikeRep);
      VdbeCoverage(v);
    }
#endif
    if( pLevel->iLeftJoin ){
      int ws = pLoop->wsFlags;
      addr = sqlite3VdbeAddOp1(v, OP_IfPos, pLevel->iLeftJoin); VdbeCoverage(v);
      assert( (ws & WHERE_IDX_ONLY)==0 || (ws & WHERE_INDEXED)!=0 );
      if( (ws & WHERE_IDX_ONLY)==0 ){
        sqlite3VdbeAddOp1(v, OP_NullRow, pTabList->a[i].iCursor);
      }
      if( (ws & WHERE_INDEXED) 
       || ((ws & WHERE_MULTI_OR) && pLevel->u.pCovidx) 
      ){
        sqlite3VdbeAddOp1(v, OP_NullRow, pLevel->iIdxCur);
      }
      if( pLevel->op==OP_Return ){
        sqlite3VdbeAddOp2(v, OP_Gosub, pLevel->p1, pLevel->addrFirst);
      }else{
        sqlite3VdbeGoto(v, pLevel->addrFirst);
      }
      sqlite3VdbeJumpHere(v, addr);
    }
    VdbeModuleComment((v, "End WHERE-loop%d: %s", i,
                     pWInfo->pTabList->a[pLevel->iFrom].pTab->zName));
  }

  /* The "break" point is here, just past the end of the outer loop.
  ** Set it.
  */
  sqlite3VdbeResolveLabel(v, pWInfo->iBreak);

  assert( pWInfo->nLevel<=pTabList->nSrc );
  for(i=0, pLevel=pWInfo->a; i<pWInfo->nLevel; i++, pLevel++){
    int k, last;
    VdbeOp *pOp;
    Index *pIdx = 0;
    struct SrcList_item *pTabItem = &pTabList->a[pLevel->iFrom];
    Table *pTab = pTabItem->pTab;
    assert( pTab!=0 );
    pLoop = pLevel->pWLoop;

    /* For a co-routine, change all OP_Column references to the table of
    ** the co-routine into OP_Copy of result contained in a register.
    ** OP_Rowid becomes OP_Null.
    */
    if( pTabItem->fg.viaCoroutine ){
      testcase( pParse->db->mallocFailed );
      translateColumnToCopy(pParse, pLevel->addrBody, pLevel->iTabCur,
                            pTabItem->regResult, 0);
      continue;
    }

    /* If this scan uses an index, make VDBE code substitutions to read data
    ** from the index instead of from the table where possible.  In some cases
    ** this optimization prevents the table from ever being read, which can
    ** yield a significant performance boost.
    ** 
    ** Calls to the code generator in between sqlite3WhereBegin and
    ** sqlite3WhereEnd will have created code that references the table
    ** directly.  This loop scans all that code looking for opcodes
    ** that reference the table and converts them into opcodes that
    ** reference the index.
    */
    if( pLoop->wsFlags & (WHERE_INDEXED|WHERE_IDX_ONLY) ){
      pIdx = pLoop->u.btree.pIndex;
    }else if( pLoop->wsFlags & WHERE_MULTI_OR ){
      pIdx = pLevel->u.pCovidx;
    }
    if( pIdx
     && (pWInfo->eOnePass==ONEPASS_OFF || !HasRowid(pIdx->pTable))
     && !db->mallocFailed
    ){
      last = sqlite3VdbeCurrentAddr(v);
      k = pLevel->addrBody;
      pOp = sqlite3VdbeGetOp(v, k);
      for(; k<last; k++, pOp++){
        if( pOp->p1!=pLevel->iTabCur ) continue;
        if( pOp->opcode==OP_Column ){
          int x = pOp->p2;
          assert( pIdx->pTable==pTab );
          if( !HasRowid(pTab) ){
            Index *pPk = sqlite3PrimaryKeyIndex(pTab);
            x = pPk->aiColumn[x];
            assert( x>=0 );
          }
          x = sqlite3ColumnOfIndex(pIdx, x);
          if( x>=0 ){
            pOp->p2 = x;
            pOp->p1 = pLevel->iIdxCur;
          }
          assert( (pLoop->wsFlags & WHERE_IDX_ONLY)==0 || x>=0 
              || pWInfo->eOnePass );
        }else if( pOp->opcode==OP_Rowid ){
          pOp->p1 = pLevel->iIdxCur;
          pOp->opcode = OP_IdxRowid;
        }else if( pOp->opcode==OP_IfNullRow ){
          pOp->p1 = pLevel->iIdxCur;
        }
      }
    }
  }

  /* Final cleanup
  */
  pParse->nQueryLoop = pWInfo->savedNQueryLoop;
  whereInfoFree(db, pWInfo);
  return;
}